

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall spdlog::details::scoped_padder::~scoped_padder(scoped_padder *this)

{
  long lVar1;
  char *begin;
  memory_buf_t *pmVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = this->remaining_pad_;
  if (lVar1 < 0) {
    if (this->padinfo_->truncate_ == true) {
      pmVar2 = this->dest_;
      uVar4 = lVar1 + (pmVar2->super_buffer<char>).size_;
      if ((pmVar2->super_buffer<char>).capacity_ < uVar4) {
        (**(pmVar2->super_buffer<char>)._vptr_buffer)(pmVar2,uVar4);
      }
      uVar3 = (pmVar2->super_buffer<char>).capacity_;
      if (uVar3 < uVar4) {
        uVar4 = uVar3;
      }
      (pmVar2->super_buffer<char>).size_ = uVar4;
    }
  }
  else {
    begin = (this->spaces_).data_;
    ::fmt::v9::detail::buffer<char>::append<char>
              (&this->dest_->super_buffer<char>,begin,begin + lVar1);
  }
  return;
}

Assistant:

~scoped_padder()
    {
        if (remaining_pad_ >= 0)
        {
            pad_it(remaining_pad_);
        }
        else if (padinfo_.truncate_)
        {
            long new_size = static_cast<long>(dest_.size()) + remaining_pad_;
            dest_.resize(static_cast<size_t>(new_size));
        }
    }